

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall QListModel::insert(QListModel *this,int row,QStringList *labels)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  QListWidget *pQVar4;
  QListWidgetItem *item_00;
  QListWidget *pQVar5;
  QList<QString> *in_RDX;
  int in_ESI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  QListWidgetItem *item_1;
  int i_1;
  QListWidgetItem *item;
  int i;
  QListWidget *view;
  int count;
  qsizetype in_stack_ffffffffffffff68;
  QListWidget *in_stack_ffffffffffffff70;
  QList<QListWidgetItem_*> *in_stack_ffffffffffffff78;
  iterator in_stack_ffffffffffffff90;
  int type;
  QListWidget *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar6;
  QListWidgetItem *in_stack_ffffffffffffffa8;
  int local_4c;
  int local_2c;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QList<QString>::size(in_RDX);
  iVar2 = (int)qVar3;
  if (0 < iVar2) {
    pQVar4 = QListModel::view((QListModel *)0x899d78);
    if ((pQVar4 == (QListWidget *)0x0) ||
       (bVar1 = QListWidget::isSortingEnabled(in_stack_ffffffffffffff70), !bVar1)) {
      if (in_ESI < 0) {
        local_2c = 0;
      }
      else {
        in_stack_ffffffffffffff78 = (QList<QListWidgetItem_*> *)(long)in_ESI;
        qVar3 = QList<QListWidgetItem_*>::size((QList<QListWidgetItem_*> *)&in_RDI->view);
        local_2c = in_ESI;
        if (qVar3 < (long)in_stack_ffffffffffffff78) {
          qVar3 = QList<QListWidgetItem_*>::size((QList<QListWidgetItem_*> *)&in_RDI->view);
          local_2c = (int)qVar3;
        }
      }
      QModelIndex::QModelIndex((QModelIndex *)0x899e5f);
      QAbstractItemModel::beginInsertRows((QModelIndex *)in_RDI,(int)local_20,local_2c);
      for (iVar6 = 0; type = (int)((ulong)in_stack_ffffffffffffff90.i >> 0x20), iVar6 < iVar2;
          iVar6 = iVar6 + 1) {
        pQVar4 = (QListWidget *)operator_new(0x28);
        QList<QString>::at((QList<QString> *)pQVar4,in_stack_ffffffffffffff68);
        QListWidgetItem::QListWidgetItem
                  (in_stack_ffffffffffffffa8,(QString *)CONCAT44(iVar6,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98,type);
        *(int *)(*(long *)&(pQVar4->super_QListView).super_QAbstractItemView.
                           super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x18 + 0x20) =
             local_2c;
        in_stack_ffffffffffffff98 = pQVar4;
        pQVar5 = QListModel::view((QListModel *)0x899ee8);
        *(QListWidget **)
         &(in_stack_ffffffffffffff98->super_QListView).super_QAbstractItemView.
          super_QAbstractScrollArea.super_QFrame.super_QWidget.super_QPaintDevice = pQVar5;
        local_2c = local_2c + 1;
        in_stack_ffffffffffffff90 =
             QList<QListWidgetItem_*>::insert(in_stack_ffffffffffffff78,(qsizetype)pQVar4,in_RDI);
      }
      QAbstractItemModel::endInsertRows();
    }
    else {
      for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
        item_00 = (QListWidgetItem *)operator_new(0x28);
        QList<QString>::at((QList<QString> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        QListWidgetItem::QListWidgetItem
                  (in_stack_ffffffffffffffa8,
                   (QString *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90.i >> 0x20));
        insert((QListModel *)in_stack_ffffffffffffff90.i,(int)((ulong)in_RDI >> 0x20),item_00);
        in_stack_ffffffffffffffa8 = item_00;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListModel::insert(int row, const QStringList &labels)
{
    const int count = labels.size();
    if (count <= 0)
        return;
    QListWidget *view = this->view();
    if (view && view->isSortingEnabled()) {
        // sorted insertion
        for (int i = 0; i < count; ++i) {
            QListWidgetItem *item = new QListWidgetItem(labels.at(i));
            insert(row, item);
        }
    } else {
        if (row < 0)
            row = 0;
        else if (row > items.size())
            row = items.size();
        beginInsertRows(QModelIndex(), row, row + count - 1);
        for (int i = 0; i < count; ++i) {
            QListWidgetItem *item = new QListWidgetItem(labels.at(i));
            item->d->theid = row;
            item->view = this->view();
            items.insert(row++, item);
        }
        endInsertRows();
    }
}